

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-assertion-result.cc
# Opt level: O0

void __thiscall
testing::AssertionResult::AssertionResult(AssertionResult *this,AssertionResult *other)

{
  bool bVar1;
  type __str;
  pointer local_58;
  AssertionResult *other_local;
  AssertionResult *this_local;
  
  this->success_ = (bool)(other->success_ & 1);
  bVar1 = std::operator==(&other->message_,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_58 = (pointer)0x0;
  }
  else {
    local_58 = (pointer)operator_new(0x20);
    __str = std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator*(&other->message_);
    std::__cxx11::string::string((string *)local_58,__str);
  }
  std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
  unique_ptr<std::default_delete<std::__cxx11::string>,void>
            ((unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>> *)
             &this->message_,local_58);
  return;
}

Assistant:

AssertionResult::AssertionResult(const AssertionResult& other)
    : success_(other.success_),
      message_(other.message_ != nullptr
                   ? new ::std::string(*other.message_)
                   : static_cast< ::std::string*>(nullptr)) {}